

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void world_timed_save(void *world_void)

{
  bool bVar1;
  mapped_type *this;
  vector<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar2;
  Database_Exception *e;
  Character *character;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  allocator local_39;
  key_type local_38;
  World *local_18;
  World *world;
  void *world_void_local;
  
  local_18 = (World *)world_void;
  world = (World *)world_void;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"TimedSave",&local_39);
  this = std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       *)((long)world_void + 0x198),&local_38);
  bVar1 = util::variant::operator_cast_to_bool(this);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = &local_18->characters;
    __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this_00);
    character = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                       *)&character), bVar1) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                ::operator*(&__end1);
      Character::Save(*ppCVar2);
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1);
    }
    GuildManager::SaveAll(local_18->guildmanager);
    World::CommitDB(local_18);
    World::BeginDB(local_18);
  }
  return;
}

Assistant:

void world_timed_save(void *world_void)
{
	World *world = static_cast<World *>(world_void);

	if (!world->config["TimedSave"])
		return;

	UTIL_FOREACH(world->characters, character)
	{
		character->Save();
	}

	world->guildmanager->SaveAll();

	try
	{
		world->CommitDB();
	}
	catch (Database_Exception& e)
	{
		Console::Wrn("Database commit failed - no data was saved!");
		world->db.Rollback();
	}

	world->BeginDB();
}